

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O2

Array_Data_Symbol * __thiscall
R10_Decoder::InactivationDecoding
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  uint32_t uVar1;
  Array_Data_Symbol local_a0;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  uVar1 = *M - this->sym_p->L;
  this->overhead = uVar1;
  this->N = uVar1 + this->sym_p->K;
  Indecoding_phase_1(&local_a0,this,A,D,M);
  Array_Data_Symbol::operator=(__return_storage_ptr__,&local_a0);
  Array_Data_Symbol::~Array_Data_Symbol(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::InactivationDecoding(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{
	//class Array_Data_Symbol _D = D;
	//uint32_t _M = M;
	class Array_Data_Symbol result;


	overhead = M - sym_p->L;
	N = sym_p->K + overhead;
	//std::cout << "M : " << M << "  overhead: " << overhead << "  N: " << N << std::endl;



	result = Indecoding_phase_1(A, D, M);



	return result;
}